

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_edge_tec_zone(REF_FACELIFT ref_facelift,REF_INT id,FILE *file)

{
  REF_DBL RVar1;
  REF_DBL RVar2;
  REF_DBL RVar3;
  REF_GRID pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  char *pcVar11;
  REF_DBL local_1e0;
  int local_1d8;
  REF_INT local_1d4;
  REF_DBL local_1a0;
  int local_198;
  REF_INT local_194;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL xyz [3];
  REF_DBL local_118;
  REF_DBL normal [3];
  REF_DBL radius;
  REF_DBL tvalue;
  REF_DBL *t;
  int local_e0;
  REF_INT jump_geom;
  REF_INT sens;
  REF_INT nedg;
  REF_INT nnode;
  REF_INT node;
  REF_INT local;
  REF_INT item;
  REF_INT nodes [27];
  int local_54;
  REF_INT cell;
  REF_INT geom;
  REF_DICT ref_dict;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  FILE *file_local;
  REF_FACELIFT pRStack_18;
  REF_INT id_local;
  REF_FACELIFT ref_facelift_local;
  
  ref_node = (REF_NODE)ref_facelift->grid;
  ref_cell = (REF_CELL)((REF_GRID)ref_node)->node;
  ref_geom = (REF_GEOM)ref_facelift->edg_cell;
  ref_dict = (REF_DICT)((REF_GRID)ref_node)->geom;
  t._4_4_ = -1;
  ref_grid = (REF_GRID)file;
  file_local._4_4_ = id;
  pRStack_18 = ref_facelift;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x3c7,"ref_facelift_edge_tec_zone","requires indirect facelift");
    ref_facelift_local._4_4_ = 1;
  }
  else {
    uVar5 = ref_dict_create((REF_DICT *)&cell);
    if (uVar5 == 0) {
      for (local_54 = 0; local_54 < ref_dict->max; local_54 = local_54 + 1) {
        if ((ref_dict->key[local_54 * 6] == 1) &&
           (file_local._4_4_ == ref_dict->key[local_54 * 6 + 1])) {
          uVar5 = ref_dict_store(_cell,ref_dict->key[local_54 * 6 + 5],local_54);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x3ce,"ref_facelift_edge_tec_zone",(ulong)uVar5,"mark nodes");
            return uVar5;
          }
          if (ref_dict->key[local_54 * 6 + 3] != 0) {
            if ((long)t._4_4_ != -1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x3d0,"ref_facelift_edge_tec_zone","should be only one jump per edge",
                     0xffffffffffffffff,(long)t._4_4_);
              return 1;
            }
            t._4_4_ = local_54;
          }
        }
      }
      sens = _cell->n;
      if (t._4_4_ != -1) {
        sens = sens + 1;
      }
      jump_geom = 0;
      for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_geom->initial_cell_height + 4);
          nodes[0x1a] = nodes[0x1a] + 1) {
        RVar6 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
        if ((RVar6 == 0) && (file_local._4_4_ == nodes[0])) {
          jump_geom = jump_geom + 1;
        }
      }
      if ((sens == 0) || (jump_geom == 0)) {
        ref_facelift_local._4_4_ = ref_dict_free(_cell);
        if (ref_facelift_local._4_4_ == 0) {
          ref_facelift_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x3e1,"ref_facelift_edge_tec_zone",(ulong)ref_facelift_local._4_4_,"free dict");
        }
      }
      else {
        pcVar11 = "felineseg";
        fprintf((FILE *)ref_grid,
                "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                (ulong)file_local._4_4_,(ulong)(uint)sens,(ulong)(uint)jump_geom,"point","felineseg"
               );
        if (sens < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x3ea,"ref_facelift_edge_tec_zone","malloc t of REF_DBL negative");
          ref_facelift_local._4_4_ = 1;
        }
        else {
          tvalue = (REF_DBL)malloc((long)sens << 3);
          if ((void *)tvalue == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x3ea,"ref_facelift_edge_tec_zone","malloc t of REF_DBL NULL");
            ref_facelift_local._4_4_ = 2;
          }
          else {
            for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_geom->initial_cell_height + 4);
                nodes[0x1a] = nodes[0x1a] + 1) {
              RVar6 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
              if ((RVar6 == 0) && (file_local._4_4_ == nodes[0])) {
                uVar5 = ref_dict_location(_cell,local,&nnode);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x3f1,"ref_facelift_edge_tec_zone",(ulong)uVar5,"localize");
                  printf("edg %d %d id %d no edge geom\n",(ulong)(uint)local,(ulong)(uint)item,
                         (ulong)(uint)nodes[0]);
                  uVar7 = ref_node_location((REF_NODE)ref_cell,local);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x3ef,"ref_facelift_edge_tec_zone",(ulong)uVar7,"loc");
                    return uVar7;
                  }
                  uVar7 = ref_geom_tattle((REF_GEOM)ref_dict,local);
                  if (uVar7 == 0) {
                    return uVar5;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x3f0,"ref_facelift_edge_tec_zone",(ulong)uVar7,"tatt");
                  return uVar7;
                }
                uVar5 = ref_geom_cell_tuv((REF_GEOM)ref_dict,local,&local,1,&radius,&local_e0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x3f4,"ref_facelift_edge_tec_zone",(ulong)uVar5,"from");
                  return uVar5;
                }
                if (local_e0 == -1) {
                  nnode = sens + -1;
                }
                *(REF_DBL *)((long)tvalue + (long)nnode * 8) = radius;
                uVar5 = ref_dict_location(_cell,item,&nnode);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x3f7,"ref_facelift_edge_tec_zone",(ulong)uVar5,"localize");
                  return uVar5;
                }
                uVar5 = ref_geom_cell_tuv((REF_GEOM)ref_dict,item,&local,1,&radius,&local_e0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x3fa,"ref_facelift_edge_tec_zone",(ulong)uVar5,"from");
                  return uVar5;
                }
                if (local_e0 == -1) {
                  nnode = sens + -1;
                }
                *(REF_DBL *)((long)tvalue + (long)nnode * 8) = radius;
              }
            }
            node = 0;
            if (_cell->n < 1) {
              local_194 = -1;
            }
            else {
              local_194 = *_cell->key;
            }
            nedg = local_194;
            if (_cell->n < 1) {
              local_198 = -1;
            }
            else {
              local_198 = *_cell->value;
            }
            local_54 = local_198;
            while (node < _cell->n) {
              normal[2] = 0.0;
              _ref_private_macro_code_rss_1 = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf) * 2);
              xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 1) * 2);
              xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 2) * 2);
              if (ref_dict[4].key != (REF_INT *)0x0) {
                uVar5 = ref_egads_edge_curvature((REF_GEOM)ref_dict,local_54,normal + 2,&local_118);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x406,"ref_facelift_edge_tec_zone",(ulong)uVar5,"curve",pcVar11);
                  return uVar5;
                }
                if (normal[2] <= 0.0) {
                  local_1a0 = -normal[2];
                }
                else {
                  local_1a0 = normal[2];
                }
                normal[2] = local_1a0;
                uVar5 = ref_egads_eval_at((REF_GEOM)ref_dict,1,file_local._4_4_,
                                          (REF_DBL *)((long)tvalue + (long)node * 8),
                                          (REF_DBL *)&ref_private_macro_code_rss_1,(REF_DBL *)0x0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x409,"ref_facelift_edge_tec_zone",(ulong)uVar5,"eval at",pcVar11);
                  return uVar5;
                }
              }
              pRVar4 = ref_grid;
              RVar3 = xyz[1];
              RVar2 = xyz[0];
              RVar1 = _ref_private_macro_code_rss_1;
              dVar8 = pow(pRStack_18->displacement[local_54 * 3],2.0);
              dVar9 = pow(pRStack_18->displacement[local_54 * 3 + 1],2.0);
              dVar10 = pow(pRStack_18->displacement[local_54 * 3 + 2],2.0);
              dVar8 = sqrt(dVar8 + dVar9 + dVar10);
              pcVar11 = (char *)pRStack_18->displacement[local_54 * 3 + 2];
              fprintf((FILE *)pRVar4," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                      RVar1,RVar2,RVar3,SUB84(dVar8,0),
                      *(undefined8 *)((long)tvalue + (long)node * 8),0,
                      pRStack_18->displacement[local_54 * 3],
                      pRStack_18->displacement[local_54 * 3 + 1]);
              node = node + 1;
              if ((node < 0) || (_cell->n <= node)) {
                local_1d4 = -1;
              }
              else {
                local_1d4 = _cell->key[node];
              }
              nedg = local_1d4;
              if ((node < 0) || (_cell->n <= node)) {
                local_1d8 = -1;
              }
              else {
                local_1d8 = _cell->value[node];
              }
              local_54 = local_1d8;
            }
            if (t._4_4_ != -1) {
              nedg = ref_dict->key[t._4_4_ * 6 + 5];
              normal[2] = 0.0;
              _ref_private_macro_code_rss_1 = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf) * 2);
              xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 1) * 2);
              xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 2) * 2);
              if (ref_dict[4].key != (REF_INT *)0x0) {
                uVar5 = ref_egads_edge_curvature((REF_GEOM)ref_dict,t._4_4_,normal + 2,&local_118);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x419,"ref_facelift_edge_tec_zone",(ulong)uVar5,"curve");
                  return uVar5;
                }
                if (normal[2] <= 0.0) {
                  local_1e0 = -normal[2];
                }
                else {
                  local_1e0 = normal[2];
                }
                normal[2] = local_1e0;
                uVar5 = ref_egads_eval_at((REF_GEOM)ref_dict,1,file_local._4_4_,
                                          (REF_DBL *)((long)tvalue + (long)(sens + -1) * 8),
                                          (REF_DBL *)&ref_private_macro_code_rss_1,(REF_DBL *)0x0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x41d,"ref_facelift_edge_tec_zone",(ulong)uVar5,"eval at");
                  return uVar5;
                }
              }
              pRVar4 = ref_grid;
              RVar3 = xyz[1];
              RVar2 = xyz[0];
              RVar1 = _ref_private_macro_code_rss_1;
              nedg = ref_dict->key[t._4_4_ * 6 + 5];
              dVar8 = pow(pRStack_18->displacement[t._4_4_ * 3],2.0);
              dVar9 = pow(pRStack_18->displacement[t._4_4_ * 3 + 1],2.0);
              dVar10 = pow(pRStack_18->displacement[t._4_4_ * 3 + 2],2.0);
              dVar8 = sqrt(dVar8 + dVar9 + dVar10);
              fprintf((FILE *)pRVar4," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                      RVar1,RVar2,RVar3,SUB84(dVar8,0),
                      *(undefined8 *)((long)tvalue + (long)(sens + -1) * 8),0,
                      pRStack_18->displacement[t._4_4_ * 3],
                      pRStack_18->displacement[t._4_4_ * 3 + 1]);
            }
            if (tvalue != 0.0) {
              free((void *)tvalue);
            }
            for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_geom->initial_cell_height + 4);
                nodes[0x1a] = nodes[0x1a] + 1) {
              RVar6 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
              if ((RVar6 == 0) && (file_local._4_4_ == nodes[0])) {
                uVar5 = ref_dict_location(_cell,local,&nnode);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x42b,"ref_facelift_edge_tec_zone",(ulong)uVar5,"localize");
                  return uVar5;
                }
                uVar5 = ref_geom_cell_tuv((REF_GEOM)ref_dict,local,&local,1,&radius,&local_e0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x42e,"ref_facelift_edge_tec_zone",(ulong)uVar5,"from");
                  return uVar5;
                }
                if (local_e0 == -1) {
                  nnode = sens + -1;
                }
                fprintf((FILE *)ref_grid," %d",(ulong)(nnode + 1));
                uVar5 = ref_dict_location(_cell,item,&nnode);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x431,"ref_facelift_edge_tec_zone",(ulong)uVar5,"localize");
                  return uVar5;
                }
                uVar5 = ref_geom_cell_tuv((REF_GEOM)ref_dict,item,&local,1,&radius,&local_e0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x434,"ref_facelift_edge_tec_zone",(ulong)uVar5,"from");
                  return uVar5;
                }
                if (local_e0 == -1) {
                  nnode = sens + -1;
                }
                fprintf((FILE *)ref_grid," %d",(ulong)(nnode + 1));
                fprintf((FILE *)ref_grid,"\n");
              }
            }
            ref_facelift_local._4_4_ = ref_dict_free(_cell);
            if (ref_facelift_local._4_4_ == 0) {
              ref_facelift_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x43b,"ref_facelift_edge_tec_zone",(ulong)ref_facelift_local._4_4_,"free dict"
                    );
            }
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x3c9,"ref_facelift_edge_tec_zone",(ulong)uVar5,"create dict");
      ref_facelift_local._4_4_ = uVar5;
    }
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_edge_tec_zone(REF_FACELIFT ref_facelift,
                                                     REF_INT id, FILE *file) {
  REF_GRID ref_grid = ref_facelift_grid(ref_facelift);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_facelift_edg(ref_facelift);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nedg, sens;
  REF_INT jump_geom = REF_EMPTY;
  REF_DBL *t, tvalue;
  REF_DBL radius, normal[3], xyz[3];

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_edge(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
      if (0 != ref_geom_jump(ref_geom, geom)) {
        REIS(REF_EMPTY, jump_geom, "should be only one jump per edge");
        jump_geom = geom;
      }
    }
  }
  nnode = ref_dict_n(ref_dict);
  if (REF_EMPTY != jump_geom) nnode++;

  nedg = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      nedg++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == nedg) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, nedg, "point", "felineseg");

  ref_malloc(t, nnode, REF_DBL);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSB(ref_dict_location(ref_dict, nodes[0], &local), "localize", {
        printf("edg %d %d id %d no edge geom\n", nodes[0], nodes[1], nodes[2]);
        RSS(ref_node_location(ref_node, nodes[0]), "loc");
        RSS(ref_geom_tattle(ref_geom, nodes[0]), "tatt");
      });
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    radius = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, geom, &radius, normal), "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[item]), xyz, NULL),
          "eval at");
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
            xyz[0], xyz[1], xyz[2], ref_facelift_distance(ref_facelift, geom),
            t[item], 0.0, ref_facelift_displacement(ref_facelift, 0, geom),
            ref_facelift_displacement(ref_facelift, 1, geom),
            ref_facelift_displacement(ref_facelift, 2, geom));
  }
  if (REF_EMPTY != jump_geom) {
    node = ref_geom_node(ref_geom, jump_geom);
    radius = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, jump_geom, &radius, normal),
          "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[nnode - 1]), xyz,
                            NULL),
          "eval at");
    }
    node = ref_geom_node(ref_geom, jump_geom);
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
            xyz[0], xyz[1], xyz[2],
            ref_facelift_distance(ref_facelift, jump_geom), t[nnode - 1], 0.0,
            ref_facelift_displacement(ref_facelift, 0, jump_geom),
            ref_facelift_displacement(ref_facelift, 1, jump_geom),
            ref_facelift_displacement(ref_facelift, 2, jump_geom));
  }
  ref_free(t);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSS(ref_dict_location(ref_dict, nodes[0], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}